

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O2

void __thiscall Trainer::Trainer<Kuhn::Game>::train(Trainer<Kuhn::Game> *this,int iterations)

{
  __node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Game *pGVar3;
  Node *pNVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  __node_base *p_Var12;
  int p;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double adStack_60 [2];
  double local_48;
  int local_3c;
  ulong local_38;
  
  adStack_60[0] = 5.3972422843602e-318;
  uVar9 = Kuhn::Game::playerNum();
  lVar6 = -((ulong)uVar9 * 8 + 0xf & 0xfffffffffffffff0);
  lVar7 = lVar6 + -0x58;
  p_Var1 = &(this->mNodeMap)._M_h._M_before_begin;
  if (iterations < 1) {
    iterations = 0;
  }
  local_3c = iterations;
  uVar13 = 0;
  do {
    if ((int)uVar13 == local_3c) {
      *(undefined8 *)((long)adStack_60 + lVar6) = 0xffffffffffffffff;
      uVar5 = *(undefined8 *)((long)adStack_60 + lVar6);
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10adf1;
      writeStrategyToBin(this,(int)uVar5);
      return;
    }
    lVar14 = 0;
    local_38 = uVar13;
    while( true ) {
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ab85;
      iVar10 = Kuhn::Game::playerNum();
      if (iVar10 <= lVar14) break;
      if (this->mUpdate[lVar14] == true) {
        pbVar2 = this->mModeStr;
        *(undefined8 *)((long)adStack_60 + lVar6) = 0x10abb5;
        bVar8 = std::operator==(pbVar2,"vanilla");
        pGVar3 = this->mGame;
        iVar10 = (int)lVar14;
        if (bVar8) {
          *(undefined8 *)((long)adStack_60 + lVar6) = 0x10abc7;
          Kuhn::Game::reset(pGVar3,false);
          pGVar3 = this->mGame;
          *(undefined8 *)((long)adStack_60 + lVar6) = 0x10abe4;
          dVar15 = CFR(this,pGVar3,iVar10,1.0,1.0);
          *(double *)((long)adStack_60 + lVar14 * 8 + lVar7 + 0x60) = dVar15;
          p_Var12 = p_Var1;
          while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
            pNVar4 = (Node *)p_Var12[5]._M_nxt;
            *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac05;
            Node::updateStrategy(pNVar4);
          }
        }
        else {
          *(undefined8 *)((long)adStack_60 + lVar6) = 1;
          uVar5 = *(undefined8 *)((long)adStack_60 + lVar6);
          *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac0f;
          Kuhn::Game::reset(pGVar3,SUB81(uVar5,0));
          pbVar2 = this->mModeStr;
          *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac22;
          bVar8 = std::operator==(pbVar2,"chance");
          if (bVar8) {
            pGVar3 = this->mGame;
            *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac43;
            dVar15 = chanceSamplingCFR(this,pGVar3,iVar10,1.0,1.0);
            *(double *)((long)adStack_60 + lVar14 * 8 + lVar7 + 0x60) = dVar15;
            p_Var12 = p_Var1;
            while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
              pNVar4 = (Node *)p_Var12[5]._M_nxt;
              *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac64;
              Node::updateStrategy(pNVar4);
            }
          }
          else {
            pbVar2 = this->mModeStr;
            *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac79;
            bVar8 = std::operator==(pbVar2,"external");
            if (bVar8) {
              pGVar3 = this->mGame;
              *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ac8f;
              dVar15 = externalSamplingCFR(this,pGVar3,iVar10);
            }
            else {
              pbVar2 = this->mModeStr;
              *(undefined8 *)((long)adStack_60 + lVar6) = 0x10aca4;
              bVar8 = std::operator==(pbVar2,"outcome");
              if (!bVar8) {
                *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ae1f;
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                              ,0x127,
                              "void Trainer::Trainer<Kuhn::Game>::train(const int) [T = Kuhn::Game]"
                             );
              }
              pGVar3 = this->mGame;
              *(undefined8 *)((long)adStack_60 + lVar6) = 0x10acd4;
              outcomeSamplingCFR((Trainer<Kuhn::Game> *)&stack0xffffffffffffffb0,(Game *)this,
                                 (int)pGVar3,iVar10,1.0,1.0,1.0);
              dVar15 = local_48;
            }
            *(double *)((long)adStack_60 + lVar14 * 8 + lVar7 + 0x60) = dVar15;
          }
        }
      }
      lVar14 = lVar14 + 1;
    }
    iVar10 = (int)local_38;
    if ((int)((local_38 & 0xffffffff) % 1000) == 0) {
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad13;
      poVar11 = std::operator<<((ostream *)&std::cout,"iteration:");
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad1e;
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar10);
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad2d;
      poVar11 = std::operator<<(poVar11,", cumulative nodes touched: ");
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad3c;
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad4b;
      poVar11 = std::operator<<(poVar11,", infosets num: ");
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad5a;
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad69;
      std::operator<<(poVar11,", expected payoffs: (");
      lVar14 = 0;
      while( true ) {
        *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad71;
        iVar10 = Kuhn::Game::playerNum();
        if (iVar10 <= lVar14) break;
        dVar15 = *(double *)((long)adStack_60 + lVar14 * 8 + lVar7 + 0x60);
        *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad8b;
        poVar11 = std::ostream::_M_insert<double>(dVar15);
        *(undefined8 *)((long)adStack_60 + lVar6) = 0x10ad9a;
        std::operator<<(poVar11,",");
        lVar14 = lVar14 + 1;
      }
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10adb2;
      poVar11 = std::operator<<((ostream *)&std::cout,")");
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10adba;
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    iVar10 = (int)local_38;
    if ((iVar10 != 0) && ((int)((local_38 & 0xffffffff) % 10000000) == 0)) {
      *(undefined8 *)((long)adStack_60 + lVar6) = 0x10adde;
      writeStrategyToBin(this,iVar10);
    }
    uVar13 = (ulong)(iVar10 + 1);
  } while( true );
}

Assistant:

void Trainer<T>::train(const int iterations) {
    double utils[mGame->playerNum()];

    for (int i = 0; i < iterations; ++i) {
        for (int p = 0; p < mGame->playerNum(); ++p) {
            if (!mUpdate[p]) {
                continue;
            }
            if (mModeStr == "vanilla") {
                mGame->reset(false);
                utils[p] = CFR(*mGame, p, 1.0, 1.0);
                for (auto & itr : mNodeMap) {
                    itr.second->updateStrategy();
                }
            } else {
                mGame->reset();
                if (mModeStr == "chance") {
                    utils[p] = chanceSamplingCFR(*mGame, p, 1.0, 1.0);
                    for (auto & itr : mNodeMap) {
                        itr.second->updateStrategy();
                    }
                } else if (mModeStr == "external") {
                    utils[p] = externalSamplingCFR(*mGame, p);
                } else if (mModeStr == "outcome") {
                    utils[p] = std::get<0>(outcomeSamplingCFR(*mGame, p, i, 1.0, 1.0, 1.0));
                } else {
                    assert(false);
                }
            }
        }
        if (i % 1000 == 0) {
            std::cout << "iteration:" << i << ", cumulative nodes touched: " << mNodeTouchedCnt << ", infosets num: " << mNodeMap.size() << ", expected payoffs: (";
            for (int p = 0; p < mGame->playerNum(); ++p) {
                std::cout << utils[p] << ",";
            }
            std::cout << ")" << std::endl;
        }
        if (i != 0 && i % 10000000 == 0) {
            writeStrategyToBin(i);
        }
    }

    writeStrategyToBin();
}